

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void soul::SanityCheckPass::checkTypeSupportedForExternalEvents(Context *context,Type *t)

{
  size_t sVar1;
  Structure *pSVar2;
  char (*in_R9) [36];
  Member *m;
  Member *t_00;
  long lVar3;
  Type TStack_68;
  CompileMessage local_50;
  
  if ((t->category & ~primitive) != wrap) {
    if (t->category == array) {
      Type::getArrayElementType(&TStack_68,t);
      checkTypeSupportedForExternalEvents(context,&TStack_68);
      RefCountedPtr<soul::Structure>::decIfNotNull(TStack_68.structure.object);
    }
    if (t->category == structure) {
      pSVar2 = Type::getStructRef(t);
      sVar1 = (pSVar2->members).numActive;
      if (sVar1 != 0) {
        t_00 = (pSVar2->members).items;
        lVar3 = sVar1 << 6;
        do {
          checkTypeSupportedForExternalEvents(context,&t_00->type);
          t_00 = t_00 + 1;
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != 0);
      }
    }
    return;
  }
  CompileMessageHelpers::createMessage<char_const(&)[36]>
            (&local_50,(CompileMessageHelpers *)0x1,none,0x26325e,
             "Endpoints using wrap or clamp types",in_R9);
  AST::Context::throwError(context,&local_50,false);
}

Assistant:

static void checkTypeSupportedForExternalEvents (const AST::Context& context, const Type& t)
    {
        if (t.isBoundedInt())
            context.throwError (Errors::notYetImplemented ("Endpoints using wrap or clamp types"));

        if (t.isArray())
            checkTypeSupportedForExternalEvents (context, t.getArrayElementType());

        if (t.isStruct())
            for (auto& m : t.getStructRef().getMembers())
                checkTypeSupportedForExternalEvents (context, m.type);
    }